

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519_64_adx.h
# Opt level: O2

void x25519_scalar_mult_adx(uint8_t *out,uint8_t *scalar,uint8_t *point)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ulong uVar5;
  ulong uVar6;
  byte bVar7;
  ulong uVar8;
  ulong uVar9;
  byte bVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  bool bVar18;
  fe4 t2;
  fe4 z3;
  fe4 t1;
  ulong local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  ulong uStack_140;
  fe4 tmp1;
  fe4 x2;
  undefined1 local_f8 [32];
  fe4 x3;
  fe4 z2;
  fe4 x1;
  fe4 t0;
  fe4 tmp0;
  
  uStack_150 = *(undefined8 *)(scalar + 8);
  local_148 = *(undefined8 *)(scalar + 0x10);
  local_158 = *(ulong *)scalar & 0xfffffffffffffff8;
  uStack_140 = *(ulong *)(scalar + 0x18) & 0x3fffffffffffffff | 0x4000000000000000;
  x2[2] = 0;
  x2[3] = 0;
  x2[0] = 1;
  x2[1] = 0;
  z2[2] = 0;
  z2[3] = 0;
  z2[0] = 0;
  z2[1] = 0;
  z3[2] = 0;
  z3[3] = 0;
  z3[0] = 1;
  z3[1] = 0;
  x1[0] = *(uint64_t *)point;
  x1[1] = *(uint64_t *)(point + 8);
  x1[2] = *(uint64_t *)(point + 0x10);
  x1[3] = *(ulong *)(point + 0x18) & 0x7fffffffffffffff;
  x3[0] = *(uint64_t *)point;
  x3[1] = *(uint64_t *)(point + 8);
  x3[2] = *(uint64_t *)(point + 0x10);
  x3[3] = x1[3];
  bVar10 = 0;
  for (uVar11 = 0xfe; -1 < (int)uVar11; uVar11 = uVar11 - 1) {
    bVar7 = *(byte *)((long)&local_158 + (ulong)(uVar11 >> 3)) >> ((byte)uVar11 & 7) & 1;
    bVar10 = bVar10 ^ bVar7;
    fe4_cswap(x2,x3,bVar10,x2,x3);
    fe4_cswap(z2,z3,bVar10,z2,z3);
    fe4_sub(tmp0,x3,z3);
    fe4_sub(tmp1,x2,z2);
    fe4_add(x2,x2,z2);
    fe4_add(z2,x3,z3);
    fiat_curve25519_adx_mul(z3,tmp0,x2);
    fiat_curve25519_adx_mul(z2,z2,tmp1);
    fiat_curve25519_adx_square(tmp0,tmp1);
    fiat_curve25519_adx_square(tmp1,x2);
    fe4_add(x3,z3,z2);
    fe4_sub(z2,z3,z2);
    fiat_curve25519_adx_mul(x2,tmp1,tmp0);
    fe4_sub(tmp1,tmp1,tmp0);
    fiat_curve25519_adx_square(z2,z2);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = tmp1[0];
    uVar15 = SUB168(ZEXT816(0x1db42) * auVar1,0);
    uVar13 = SUB168(ZEXT816(0x1db42) * auVar1,8);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = tmp1[1];
    uVar5 = SUB168(ZEXT816(0x1db42) * auVar2,0);
    uVar16 = SUB168(ZEXT816(0x1db42) * auVar2,8);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = tmp1[2];
    uVar8 = SUB168(ZEXT816(0x1db42) * auVar3,0);
    uVar17 = SUB168(ZEXT816(0x1db42) * auVar3,8);
    uVar6 = uVar5 + uVar13;
    uVar5 = (ulong)CARRY8(uVar5,uVar13);
    uVar13 = uVar8 + uVar16;
    uVar9 = uVar13 + uVar5;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = tmp1[3];
    uVar14 = SUB168(ZEXT816(0x1db42) * auVar4,0);
    uVar5 = (ulong)(CARRY8(uVar8,uVar16) || CARRY8(uVar13,uVar5));
    uVar13 = uVar14 + uVar17;
    uVar8 = uVar13 + uVar5;
    uVar13 = (SUB168(ZEXT816(0x1db42) * auVar4,8) +
             (ulong)(CARRY8(uVar14,uVar17) || CARRY8(uVar13,uVar5))) * 0x26;
    uVar5 = (ulong)CARRY8(uVar13,uVar15);
    z3[1] = uVar6 + uVar5;
    uVar5 = (ulong)CARRY8(uVar6,uVar5);
    z3[2] = uVar9 + uVar5;
    uVar5 = (ulong)CARRY8(uVar9,uVar5);
    z3[3] = uVar8 + uVar5;
    z3[0] = uVar13 + uVar15 + (ulong)(-(uint)CARRY8(uVar8,uVar5) & 0x26);
    fiat_curve25519_adx_square(x3,x3);
    fe4_add(tmp0,tmp0,z3);
    fiat_curve25519_adx_mul(z3,x1,z2);
    fiat_curve25519_adx_mul(z2,tmp1,tmp0);
    bVar10 = bVar7;
  }
  fe4_cswap(x2,x3,bVar10,x2,x3);
  fe4_cswap(z2,z3,bVar10,z2,z3);
  fiat_curve25519_adx_square(t0,z2);
  fiat_curve25519_adx_square(t1,t0);
  fiat_curve25519_adx_square(t1,t1);
  fiat_curve25519_adx_mul(t1,z2,t1);
  fiat_curve25519_adx_mul(t0,t0,t1);
  fiat_curve25519_adx_square(t2,t0);
  fiat_curve25519_adx_mul(t1,t1,t2);
  fiat_curve25519_adx_square(t2,t1);
  iVar12 = 4;
  while (bVar18 = iVar12 != 0, iVar12 = iVar12 + -1, bVar18) {
    fiat_curve25519_adx_square(t2,t2);
  }
  fiat_curve25519_adx_mul(t1,t2,t1);
  fiat_curve25519_adx_square(t2,t1);
  iVar12 = 9;
  while (bVar18 = iVar12 != 0, iVar12 = iVar12 + -1, bVar18) {
    fiat_curve25519_adx_square(t2,t2);
  }
  fiat_curve25519_adx_mul(t2,t2,t1);
  fiat_curve25519_adx_square(local_f8,t2);
  iVar12 = 0x13;
  while (bVar18 = iVar12 != 0, iVar12 = iVar12 + -1, bVar18) {
    fiat_curve25519_adx_square(local_f8,local_f8);
  }
  fiat_curve25519_adx_mul(t2,local_f8,t2);
  fiat_curve25519_adx_square(t2,t2);
  iVar12 = 9;
  while (bVar18 = iVar12 != 0, iVar12 = iVar12 + -1, bVar18) {
    fiat_curve25519_adx_square(t2,t2);
  }
  fiat_curve25519_adx_mul(t1,t2,t1);
  fiat_curve25519_adx_square(t2,t1);
  iVar12 = 0x31;
  while (bVar18 = iVar12 != 0, iVar12 = iVar12 + -1, bVar18) {
    fiat_curve25519_adx_square(t2,t2);
  }
  fiat_curve25519_adx_mul(t2,t2,t1);
  fiat_curve25519_adx_square(local_f8,t2);
  iVar12 = 99;
  while (bVar18 = iVar12 != 0, iVar12 = iVar12 + -1, bVar18) {
    fiat_curve25519_adx_square(local_f8,local_f8);
  }
  fiat_curve25519_adx_mul(t2,local_f8,t2);
  fiat_curve25519_adx_square(t2,t2);
  iVar12 = 0x31;
  while (bVar18 = iVar12 != 0, iVar12 = iVar12 + -1, bVar18) {
    fiat_curve25519_adx_square(t2,t2);
  }
  fiat_curve25519_adx_mul(t1,t2,t1);
  fiat_curve25519_adx_square(t1,t1);
  iVar12 = 4;
  while (bVar18 = iVar12 != 0, iVar12 = iVar12 + -1, bVar18) {
    fiat_curve25519_adx_square(t1,t1);
  }
  fiat_curve25519_adx_mul(z2,t1,t0);
  fiat_curve25519_adx_mul(x2,x2,z2);
  fe4_canon(x2,x2);
  *(uint64_t *)(out + 0x10) = x2[2];
  *(uint64_t *)(out + 0x18) = x2[3];
  *(uint64_t *)out = x2[0];
  *(uint64_t *)(out + 8) = x2[1];
  return;
}

Assistant:

__attribute__((target("adx,bmi2")))
void x25519_scalar_mult_adx(uint8_t out[32], const uint8_t scalar[32],
                            const uint8_t point[32]) {
  uint8_t e[32];
  OPENSSL_memcpy(e, scalar, 32);
  e[0] &= 248;
  e[31] &= 127;
  e[31] |= 64;

  // The following implementation was transcribed to Coq and proven to
  // correspond to unary scalar multiplication in affine coordinates given that
  // x1 != 0 is the x coordinate of some point on the curve. It was also checked
  // in Coq that doing a ladderstep with x1 = x3 = 0 gives z2' = z3' = 0, and z2
  // = z3 = 0 gives z2' = z3' = 0. The statement was quantified over the
  // underlying field, so it applies to Curve25519 itself and the quadratic
  // twist of Curve25519. It was not proven in Coq that prime-field arithmetic
  // correctly simulates extension-field arithmetic on prime-field values.
  // The decoding of the byte array representation of e was not considered.
  // Specification of Montgomery curves in affine coordinates:
  // <https://github.com/mit-plv/fiat-crypto/blob/2456d821825521f7e03e65882cc3521795b0320f/src/Spec/MontgomeryCurve.v#L27>
  // Proof that these form a group that is isomorphic to a Weierstrass curve:
  // <https://github.com/mit-plv/fiat-crypto/blob/2456d821825521f7e03e65882cc3521795b0320f/src/Curves/Montgomery/AffineProofs.v#L35>
  // Coq transcription and correctness proof of the loop (where scalarbits=255):
  // <https://github.com/mit-plv/fiat-crypto/blob/2456d821825521f7e03e65882cc3521795b0320f/src/Curves/Montgomery/XZ.v#L118>
  // <https://github.com/mit-plv/fiat-crypto/blob/2456d821825521f7e03e65882cc3521795b0320f/src/Curves/Montgomery/XZProofs.v#L278>
  // preconditions: 0 <= e < 2^255 (not necessarily e < order), fe_invert(0) = 0
  fe4 x1, x2 = {1}, z2 = {0}, x3, z3 = {1}, tmp0, tmp1;
  OPENSSL_memcpy(x1, point, sizeof(fe4));
  x1[3] &= (uint64_t)(-1)>>1;
  OPENSSL_memcpy(x3, x1, sizeof(fe4));

  unsigned swap = 0;
  int pos;
  for (pos = 254; pos >= 0; --pos) {
    // loop invariant as of right before the test, for the case where x1 != 0:
    //   pos >= -1; if z2 = 0 then x2 is nonzero; if z3 = 0 then x3 is nonzero
    //   let r := e >> (pos+1) in the following equalities of projective points:
    //   to_xz (r*P)     === if swap then (x3, z3) else (x2, z2)
    //   to_xz ((r+1)*P) === if swap then (x2, z2) else (x3, z3)
    //   x1 is the nonzero x coordinate of the nonzero point (r*P-(r+1)*P)
    unsigned b = 1 & (e[pos / 8] >> (pos & 7));
    swap ^= b;
    fe4_cswap(x2, x3, swap, x2, x3);
    fe4_cswap(z2, z3, swap, z2, z3);
    swap = b;
    // Coq transcription of ladderstep formula (called from transcribed loop):
    // <https://github.com/mit-plv/fiat-crypto/blob/2456d821825521f7e03e65882cc3521795b0320f/src/Curves/Montgomery/XZ.v#L89>
    // <https://github.com/mit-plv/fiat-crypto/blob/2456d821825521f7e03e65882cc3521795b0320f/src/Curves/Montgomery/XZProofs.v#L131>
    // x1 != 0 <https://github.com/mit-plv/fiat-crypto/blob/2456d821825521f7e03e65882cc3521795b0320f/src/Curves/Montgomery/XZProofs.v#L217>
    // x1  = 0 <https://github.com/mit-plv/fiat-crypto/blob/2456d821825521f7e03e65882cc3521795b0320f/src/Curves/Montgomery/XZProofs.v#L147>
    fe4_sub(tmp0, x3, z3);
    fe4_sub(tmp1, x2, z2);
    fe4_add(x2, x2, z2);
    fe4_add(z2, x3, z3);
    fe4_mul(z3, tmp0, x2);
    fe4_mul(z2, z2, tmp1);
    fe4_sq(tmp0, tmp1);
    fe4_sq(tmp1, x2);
    fe4_add(x3, z3, z2);
    fe4_sub(z2, z3, z2);
    fe4_mul(x2, tmp1, tmp0);
    fe4_sub(tmp1, tmp1, tmp0);
    fe4_sq(z2, z2);
    fe4_scmul(z3, tmp1, 121666);
    fe4_sq(x3, x3);
    fe4_add(tmp0, tmp0, z3);
    fe4_mul(z3, x1, z2);
    fe4_mul(z2, tmp1, tmp0);
  }
  // here pos=-1, so r=e, so to_xz (e*P) === if swap then (x3, z3) else (x2, z2)
  fe4_cswap(x2, x3, swap, x2, x3);
  fe4_cswap(z2, z3, swap, z2, z3);

  fe4_invert(z2, z2);
  fe4_mul(x2, x2, z2);
  fe4_canon(x2, x2);
  OPENSSL_memcpy(out, x2, sizeof(fe4));
}